

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

void * SyMemBackendRealloc(SyMemBackend *pBackend,void *pOld,sxu32 nByte)

{
  SyMemBlock *pSVar1;
  long lVar2;
  SyMemBlock **ppSVar3;
  bool bVar4;
  int iVar5;
  SyMemBlock *pSVar6;
  SyMemBlock **ppSVar7;
  ProcMemError p_Var8;
  uint uVar9;
  SyMemBlock *pSVar10;
  
  if ((pBackend->pMutexMethods != (SyMutexMethods *)0x0) && (pBackend->pMutex != (SyMutex *)0x0)) {
    (*pBackend->pMutexMethods->xEnter)(pBackend->pMutex);
  }
  if (pOld == (void *)0x0) {
    pSVar6 = (SyMemBlock *)MemBackendAlloc(pBackend,nByte);
  }
  else {
    pSVar1 = (SyMemBlock *)((long)pOld + -0x10);
    lVar2 = *(long *)((long)pOld + -0x10);
    ppSVar3 = *(SyMemBlock ***)((long)pOld + -8);
    pSVar6 = (SyMemBlock *)(*pBackend->pMethods->xRealloc)(pSVar1,nByte + 0x10);
    if (pSVar6 == (SyMemBlock *)0x0) {
      p_Var8 = pBackend->xMemError;
      pSVar10 = (SyMemBlock *)0x0;
      pSVar6 = pSVar10;
      if (p_Var8 != (ProcMemError)0x0) {
        uVar9 = 0;
        while (iVar5 = (*p_Var8)(pBackend->pUserData), pSVar6 = pSVar10, iVar5 == -0x21) {
          pSVar6 = (SyMemBlock *)(*pBackend->pMethods->xRealloc)(pSVar1,nByte + 0x10);
          if (pSVar6 != (SyMemBlock *)0x0) goto LAB_0010f6a8;
          p_Var8 = pBackend->xMemError;
          pSVar6 = pSVar10;
          if ((p_Var8 == (ProcMemError)0x0) ||
             (bVar4 = 2 < uVar9, pSVar6 = (SyMemBlock *)0x0, uVar9 = uVar9 + 1, bVar4)) break;
        }
      }
    }
    else {
LAB_0010f6a8:
      if (pSVar6 != pSVar1) {
        ppSVar7 = &pBackend->pBlocks;
        if (ppSVar3 != (SyMemBlock **)0x0) {
          ppSVar7 = ppSVar3;
        }
        *ppSVar7 = pSVar6;
        if (lVar2 != 0) {
          *(SyMemBlock **)(lVar2 + 8) = pSVar6;
        }
      }
      pSVar6 = pSVar6 + 1;
    }
  }
  if ((pBackend->pMutexMethods != (SyMutexMethods *)0x0) && (pBackend->pMutex != (SyMutex *)0x0)) {
    (*pBackend->pMutexMethods->xLeave)(pBackend->pMutex);
  }
  return pSVar6;
}

Assistant:

JX9_PRIVATE void * SyMemBackendRealloc(SyMemBackend *pBackend, void * pOld, sxu32 nByte)
{
	void *pChunk;
#if defined(UNTRUST)
	if( SXMEM_BACKEND_CORRUPT(pBackend)  ){
		return 0;
	}
#endif
	if( pBackend->pMutexMethods ){
		SyMutexEnter(pBackend->pMutexMethods, pBackend->pMutex);
	}
	pChunk = MemBackendRealloc(&(*pBackend), pOld, nByte);
	if( pBackend->pMutexMethods ){
		SyMutexLeave(pBackend->pMutexMethods, pBackend->pMutex);
	}
	return pChunk;
}